

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::LoginMessage::LoginMessage
          (LoginMessage *this,string *username,string *password,string *alias,string *application,
          string *application_version,string *api,string *api_version,string *product_serial_number)

{
  (this->super_PixieMessage)._vptr_PixieMessage = (_func_int **)&PTR_Encode_001e6988;
  (this->username_)._M_dataplus._M_p = (pointer)&(this->username_).field_2;
  (this->username_)._M_string_length = 0;
  (this->username_).field_2._M_local_buf[0] = '\0';
  (this->password_)._M_dataplus._M_p = (pointer)&(this->password_).field_2;
  (this->password_)._M_string_length = 0;
  (this->password_).field_2._M_local_buf[0] = '\0';
  (this->alias_)._M_dataplus._M_p = (pointer)&(this->alias_).field_2;
  (this->alias_)._M_string_length = 0;
  (this->alias_).field_2._M_local_buf[0] = '\0';
  (this->application_)._M_dataplus._M_p = (pointer)&(this->application_).field_2;
  (this->application_)._M_string_length = 0;
  (this->application_).field_2._M_local_buf[0] = '\0';
  (this->application_version_)._M_dataplus._M_p = (pointer)&(this->application_version_).field_2;
  (this->application_version_)._M_string_length = 0;
  (this->application_version_).field_2._M_local_buf[0] = '\0';
  (this->api_)._M_dataplus._M_p = (pointer)&(this->api_).field_2;
  (this->api_)._M_string_length = 0;
  (this->api_).field_2._M_local_buf[0] = '\0';
  (this->api_version_)._M_dataplus._M_p = (pointer)&(this->api_version_).field_2;
  (this->api_version_)._M_string_length = 0;
  (this->api_version_).field_2._M_local_buf[0] = '\0';
  (this->product_)._M_dataplus._M_p = (pointer)&(this->product_).field_2;
  (this->product_)._M_string_length = 0;
  (this->product_).field_2._M_local_buf[0] = '\0';
  (this->product_serial_number_)._M_dataplus._M_p = (pointer)&(this->product_serial_number_).field_2
  ;
  (this->product_serial_number_)._M_string_length = 0;
  (this->product_serial_number_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->username_);
  std::__cxx11::string::_M_assign((string *)&this->password_);
  std::__cxx11::string::_M_assign((string *)&this->alias_);
  std::__cxx11::string::_M_assign((string *)&this->application_);
  std::__cxx11::string::_M_assign((string *)&this->application_version_);
  std::__cxx11::string::_M_assign((string *)&this->api_);
  std::__cxx11::string::_M_assign((string *)&this->api_version_);
  std::__cxx11::string::_M_replace
            ((ulong)&this->product_,0,(char *)(this->product_)._M_string_length,0x1c4017);
  std::__cxx11::string::_M_assign((string *)&this->product_serial_number_);
  return;
}

Assistant:

LoginMessage::LoginMessage(std::string username, std::string password, std::string alias, std::string application,
                           std::string application_version, std::string api, std::string api_version, std::string product_serial_number)
{
    username_ = username;
    password_ = password;
    alias_ = alias;
    application_ = application;
    application_version_ = application_version;
    api_ = api;
    api_version_ = api_version;
    product_ = "BidFXCpp";
    product_serial_number_ = product_serial_number;
}